

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int cx;
  int cy;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int num_vertices;
  int iVar13;
  nk_allocator *alloc;
  stbtt_vertex *psVar14;
  ulong uVar15;
  ushort *puVar16;
  ushort *puVar17;
  stbtt_vertex *psVar18;
  ulong uVar19;
  short sVar20;
  int was_off;
  stbtt_int32 cx_00;
  stbtt_int32 sVar21;
  uint start_off;
  long lVar22;
  long lVar23;
  byte bVar24;
  short sVar25;
  int sx;
  byte bVar26;
  int sy;
  ushort uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  stbtt_int32 cy_00;
  stbtt_int32 sVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  ulong local_128;
  stbtt__csctx count_ctx;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  if ((info->cff).size != 0) {
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx._4_12_ = SUB1612((undefined1  [16])0x0,4);
    count_ctx.bounds = 1;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    iVar11 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar11 != 0) {
      psVar14 = (stbtt_vertex *)
                (**(code **)((long)info->userdata + 8))
                          (*info->userdata,0,(long)count_ctx.num_vertices * 0xe);
      *pvertices = psVar14;
      local_48._8_8_ = psVar14;
      iVar11 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)local_68);
      if (iVar11 != 0) {
        return (int)local_38;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
    return 0;
  }
  puVar3 = info->data;
  uVar12 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar12 < 0) {
LAB_0010ed67:
    local_128._0_4_ = 0;
  }
  else {
    uVar15 = (ulong)uVar12;
    uVar10 = CONCAT11(puVar3[uVar15],puVar3[uVar15 + 1]);
    if ((short)uVar10 < 1) {
      if ((short)((ushort)puVar3[uVar15] << 8) < 0) {
        puVar16 = (ushort *)(puVar3 + uVar15 + 10);
        local_128 = 0;
        psVar14 = (stbtt_vertex *)0x0;
        bVar24 = 1;
        do {
          bVar26 = bVar24;
          if (bVar26 == 0) break;
          auVar36._8_8_ = 0;
          auVar36._0_4_ = count_ctx.first_x;
          auVar36._4_4_ = count_ctx.first_y;
          count_ctx._0_16_ = auVar36 << 0x40;
          bVar24 = *(byte *)((long)puVar16 + 1);
          puVar17 = puVar16 + 2;
          fVar40 = 0.0;
          fVar41 = 0.0;
          if ((bVar24 & 2) != 0) {
            if ((bVar24 & 1) == 0) {
              fVar40 = (float)(int)(char)*puVar17;
              fVar41 = (float)(int)((long)((ulong)*(byte *)((long)puVar16 + 5) << 0x38) >> 0x38);
              puVar17 = puVar16 + 3;
            }
            else {
              auVar7._9_7_ = 0;
              auVar7._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar6._10_6_ = 0;
              auVar6._0_10_ = SUB1610(auVar7 << 0x38,6);
              auVar5._11_5_ = 0;
              auVar5._0_11_ = SUB1611(auVar6 << 0x30,5);
              auVar8._1_12_ = SUB1612(auVar5 << 0x28,4);
              auVar8[0] = (char)puVar16[3];
              auVar8._13_3_ = 0;
              auVar4._1_14_ = SUB1614(auVar8 << 0x18,2);
              auVar4[0] = (char)*puVar17;
              auVar4[0xf] = 0;
              auVar36 = ZEXT416((uint)*(byte *)((long)puVar16 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar16 + 5)) | auVar4 << 8;
              fVar40 = (float)(int)auVar36._0_2_;
              fVar41 = (float)(int)auVar36._2_2_;
              puVar17 = puVar16 + 4;
            }
          }
          uVar10 = puVar16[1];
          if ((bVar24 & 8) == 0) {
            if ((bVar24 & 0x40) != 0) {
              fVar42 = (float)(int)(short)(*puVar17 << 8 | *puVar17 >> 8) * 6.1035156e-05;
              puVar16 = puVar17 + 2;
              fVar45 = (float)(int)(short)(puVar17[1] << 8 | puVar17[1] >> 8) * 6.1035156e-05;
              goto LAB_0010ea77;
            }
            if ((char)bVar24 < '\0') {
              fVar42 = (float)(int)CONCAT11((char)*puVar17,*(char *)((long)puVar17 + 1)) *
                       6.1035156e-05;
              fVar43 = (float)(int)((long)((ulong)CONCAT11((char)puVar17[1],
                                                           *(char *)((long)puVar17 + 3)) << 0x30) >>
                                   0x30) * 6.1035156e-05;
              fVar44 = (float)(int)CONCAT11((char)puVar17[2],*(char *)((long)puVar17 + 5)) *
                       6.1035156e-05;
              fVar45 = (float)(int)((long)((ulong)CONCAT11((char)puVar17[3],
                                                           *(char *)((long)puVar17 + 7)) << 0x30) >>
                                   0x30) * 6.1035156e-05;
              puVar16 = puVar17 + 4;
            }
            else {
              fVar42 = 1.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 1.0;
              puVar16 = puVar17;
            }
          }
          else {
            fVar42 = (float)(int)(short)(*puVar17 << 8 | *puVar17 >> 8) * 6.1035156e-05;
            puVar16 = puVar17 + 1;
            fVar45 = fVar42;
LAB_0010ea77:
            fVar43 = 0.0;
            fVar44 = 0.0;
          }
          fVar33 = fVar42 * fVar42 + fVar43 * fVar43;
          if (fVar33 < 0.0) {
            fVar33 = sqrtf(fVar33);
          }
          else {
            fVar33 = SQRT(fVar33);
          }
          fVar34 = fVar44 * fVar44 + fVar45 * fVar45;
          if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          uVar12 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar10 << 8 | uVar10 >> 8),
                                       (stbtt_vertex **)&count_ctx);
          if ((int)uVar12 < 1) {
LAB_0010ec79:
            bVar9 = true;
            bVar24 = bVar24 & 0x20;
          }
          else {
            lVar22 = 0;
            do {
              fVar37 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar22) << 0x30)
                                   >> 0x30);
              fVar38 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar22);
              fVar39 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar22) << 0x30)
                                   >> 0x30);
              auVar35._0_4_ =
                   (int)((fVar38 * fVar44 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar22) * fVar42 + fVar40) *
                        fVar33);
              auVar35._4_4_ =
                   (int)((fVar38 * fVar45 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar22) * fVar43 + fVar41) *
                        fVar34);
              auVar35._8_4_ = (int)((fVar39 * fVar44 + fVar37 * fVar42 + fVar40) * fVar33);
              auVar35._12_4_ = (int)((fVar39 * fVar45 + fVar37 * fVar43 + fVar41) * fVar34);
              auVar36 = packssdw(auVar35,auVar35);
              *(long *)(count_ctx._0_8_ + lVar22) = auVar36._0_8_;
              lVar22 = lVar22 + 0xe;
            } while ((ulong)uVar12 * 0xe != lVar22);
            psVar18 = (stbtt_vertex *)
                      (**(code **)((long)info->userdata + 8))
                                (*info->userdata,0,(ulong)(uVar12 + (int)local_128) * 0xe);
            if (psVar18 != (stbtt_vertex *)0x0) {
              if (0 < (int)local_128) {
                memcpy(psVar18,psVar14,local_128 * 0xe);
              }
              memcpy(psVar18 + local_128,(void *)count_ctx._0_8_,(ulong)uVar12 * 0xe);
              if (psVar14 != (stbtt_vertex *)0x0) {
                (**(code **)((long)info->userdata + 0x10))(*info->userdata,psVar14);
              }
              (**(code **)((long)info->userdata + 0x10))(*info->userdata,count_ctx._0_8_);
              local_128 = (ulong)(uVar12 + (int)local_128);
              psVar14 = psVar18;
              goto LAB_0010ec79;
            }
            if (psVar14 != (stbtt_vertex *)0x0) {
              (**(code **)((long)info->userdata + 0x10))(*info->userdata);
            }
            if (count_ctx._0_8_ != 0) {
              (**(code **)((long)info->userdata + 0x10))(*info->userdata);
            }
            bVar9 = false;
            bVar24 = bVar26;
          }
        } while (bVar9);
        if (bVar26 != 0) goto LAB_0010ed67;
      }
      else {
        local_128._0_4_ = 0;
        psVar14 = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar12 = (uint)uVar10 * 2;
      uVar32 = (ulong)uVar12;
      bVar24 = puVar3[uVar32 + uVar15 + 10];
      bVar26 = puVar3[uVar32 + uVar15 + 0xb];
      iVar11 = (uint)puVar3[uVar32 + uVar15 + 8] * 0x100;
      bVar1 = puVar3[uVar32 + uVar15 + 9];
      psVar14 = (stbtt_vertex *)
                (**(code **)((long)info->userdata + 8))
                          (*info->userdata,0,(iVar11 + (uint)bVar1 + (uint)uVar10 * 2) * 0xe + 0xe);
      local_128._0_4_ = 0;
      if (psVar14 != (stbtt_vertex *)0x0) {
        puVar16 = (ushort *)(puVar3 + (ulong)bVar24 * 0x100 + (ulong)bVar26 + uVar32 + uVar15 + 0xc)
        ;
        uVar19 = (ulong)(iVar11 + (uint)bVar1);
        lVar22 = 0;
        bVar24 = 0;
        bVar26 = 0;
        do {
          if (bVar26 == 0) {
            bVar24 = (byte)*puVar16;
            if ((bVar24 & 8) == 0) {
              puVar16 = (ushort *)((long)puVar16 + 1);
            }
            else {
              bVar26 = *(byte *)((long)puVar16 + 1);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            bVar26 = bVar26 - 1;
          }
          *(byte *)((long)psVar14 + lVar22 + (ulong)uVar10 * 0x20 + uVar32 * -2 + 0xc) = bVar24;
          lVar22 = lVar22 + 0xe;
        } while ((ulong)((iVar11 + (uint)bVar1 + 1) * 0x10) - (uVar19 * 2 + 2) != lVar22);
        lVar22 = (ulong)(uint)((int)(uVar32 & 0xffff) << 4) + (uVar32 & 0xffff) * -2;
        lVar23 = 0;
        sVar25 = 0;
        do {
          bVar24 = *(byte *)((long)psVar14 + lVar23 + lVar22 + 0xc);
          if ((bVar24 & 2) == 0) {
            if ((bVar24 & 0x10) == 0) {
              sVar25 = sVar25 + (*puVar16 << 8 | *puVar16 >> 8);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            uVar10 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar27 = -(ushort)(byte)uVar10;
            if ((bVar24 & 0x10) != 0) {
              uVar27 = (ushort)(byte)uVar10;
            }
            sVar25 = sVar25 + uVar27;
          }
          *(short *)((long)psVar14 + lVar23 + lVar22) = sVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)((iVar11 + (uint)bVar1 + 1) * 0x10) - (uVar19 * 2 + 2) != lVar23);
        lVar23 = (ulong)((uVar12 & 0xffff) << 4) + (ulong)(uVar12 & 0xffff) * -2;
        lVar22 = 0;
        sVar25 = 0;
        do {
          bVar24 = *(byte *)((long)psVar14 + lVar22 + lVar23 + 0xc);
          if ((bVar24 & 4) == 0) {
            if ((bVar24 & 0x20) == 0) {
              sVar25 = sVar25 + (*puVar16 << 8 | *puVar16 >> 8);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            uVar10 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar27 = -(ushort)(byte)uVar10;
            if ((bVar24 & 0x20) != 0) {
              uVar27 = (ushort)(byte)uVar10;
            }
            sVar25 = sVar25 + uVar27;
          }
          *(short *)((long)psVar14 + lVar22 + lVar23 + 2) = sVar25;
          lVar22 = lVar22 + 0xe;
        } while ((ulong)((iVar11 + (uint)bVar1 + 1) * 0x10) - (uVar19 * 2 + 2) != lVar22);
        num_vertices = 0;
        iVar29 = 0;
        iVar28 = 0;
        iVar13 = 0;
        sVar31 = 0;
        sVar21 = 0;
        sy = 0;
        sx = 0;
        start_off = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar22 = (long)(int)(uVar12 + iVar29);
          bVar24 = psVar14[lVar22].type;
          sVar25 = psVar14[lVar22].x;
          sVar2 = psVar14[lVar22].y;
          cx_00 = (stbtt_int32)sVar25;
          cy_00 = (stbtt_int32)sVar2;
          if (iVar13 == iVar29) {
            if (iVar29 != 0) {
              num_vertices = stbtt__close_shape(psVar14,num_vertices,was_off,start_off,sx,sy,sVar21,
                                                sVar31,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar24 & 1) == 0) {
              sVar21 = cx_00;
              sVar31 = cy_00;
              if ((psVar14[lVar22 + 1].type & 1) == 0) {
                sx = psVar14[lVar22 + 1].x + cx_00 >> 1;
                sy = psVar14[lVar22 + 1].y + cy_00 >> 1;
              }
              else {
                iVar29 = iVar29 + 1;
                sx = (int)psVar14[lVar22 + 1].x;
                sy = (int)psVar14[lVar22 + 1].y;
              }
            }
            start_off = bVar24 & 1 ^ 1;
            psVar14[num_vertices].type = '\x01';
            psVar14[num_vertices].x = (short)sx;
            psVar14[num_vertices].y = (short)sy;
            psVar14[num_vertices].cx = 0;
            psVar14[num_vertices].cy = 0;
            iVar13 = (ushort)(*(ushort *)(puVar3 + (long)iVar28 * 2 + uVar15 + 10) << 8 |
                             *(ushort *)(puVar3 + (long)iVar28 * 2 + uVar15 + 10) >> 8) + 1;
            iVar28 = iVar28 + 1;
            was_off = 0;
            iVar30 = iVar29;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar20 = (short)cy;
            iVar30 = iVar29;
            if ((bVar24 & 1) == 0) {
              iVar29 = num_vertices;
              if (was_off != 0) {
                iVar29 = num_vertices + 1;
                psVar14[num_vertices].type = '\x03';
                psVar14[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                psVar14[num_vertices].y = (short)((uint)(cy_00 + cy) >> 1);
                psVar14[num_vertices].cx = (short)cx;
                psVar14[num_vertices].cy = sVar20;
              }
              was_off = 1;
              num_vertices = iVar29;
            }
            else {
              psVar18 = psVar14 + num_vertices;
              if (was_off == 0) {
                psVar18->type = '\x02';
                psVar18->x = sVar25;
                psVar18->y = sVar2;
                psVar18->cx = 0;
                sVar20 = 0;
              }
              else {
                psVar18->type = '\x03';
                psVar18->x = sVar25;
                psVar18->y = sVar2;
                psVar18->cx = (short)cx;
              }
              psVar18->cy = sVar20;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar29 = iVar30 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar30 < (int)(iVar11 + (uint)bVar1));
        local_128._0_4_ =
             stbtt__close_shape(psVar14,num_vertices,was_off,start_off,sx,sy,sVar21,sVar31,cx_00,
                                cy_00);
      }
      if (psVar14 == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *pvertices = psVar14;
  }
  return (int)local_128;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
if (!info->cff.size)
return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
else
return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}